

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isMipmapLinearSampleResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               FilterMode levelFilter,LookupPrecision *prec,float coordX,int coordY,Vec2 *fBounds,
               Vec4 *result)

{
  int dim;
  int dim_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Vec4 *b;
  bool bVar3;
  TextureChannelClass TVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 uVar7;
  uint uVar8;
  int x1;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  int i1;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined4 extraout_XMM0_Db;
  float fVar17;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar18;
  float fVar19;
  uint uVar20;
  float fVar21;
  uint uVar22;
  int w0;
  Vec4 maxVal;
  Vec4 minVal;
  ColorLine line0;
  Vec2 uBounds1;
  Vec2 uBounds0;
  bool local_1a5;
  float local_1a4;
  float local_1a0;
  float local_19c;
  Vector<float,_4> local_138;
  Vector<float,_4> local_128;
  ColorLine local_118;
  ConstPixelBufferAccess *local_f8;
  BVec4 *local_f0;
  Vec4 *local_e8;
  float local_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  Vector<bool,_4> local_d0 [4];
  tcu local_c0 [4];
  tcu local_bc [4];
  undefined1 local_b8 [16];
  float local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  float local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  float local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  ColorLine local_70;
  tcu local_50 [16];
  tcu local_40 [16];
  
  dim = (level0->m_size).m_data[0];
  dim_00 = (level1->m_size).m_data[0];
  if (levelFilter == LINEAR) {
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&local_d8,sampler->normalizedCoords,dim,coordX,
               (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&local_e0,sampler->normalizedCoords,dim_00,coordX,
               (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
    fVar11 = floorf(local_d8 + -0.5);
    fVar12 = floorf(fStack_d4 + -0.5);
    fVar13 = floorf(local_e0 + -0.5);
    fVar14 = floorf(fStack_dc + -0.5);
    TVar4 = getTextureChannelClass((level0->m_format).type);
    local_f8 = level0;
    if (TVar4 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      local_19c = computeBilinearSearchStepForSnorm(prec);
    }
    else {
      local_19c = 0.0;
      if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
        local_19c = computeBilinearSearchStepForUnorm(prec);
      }
    }
    local_e8 = &prec->colorThreshold;
    local_f0 = &prec->colorMask;
    iVar9 = (int)fVar11;
    while( true ) {
      local_1a5 = iVar9 <= (int)fVar12;
      if ((int)fVar12 < iVar9) break;
      ColorLine::ColorLine(&local_118);
      iVar5 = TexVerifierUtil::wrap(sampler->wrapS,iVar9,dim);
      iVar10 = iVar9 + 1;
      iVar6 = TexVerifierUtil::wrap(sampler->wrapS,iVar10,dim);
      lookupLine(&local_118,local_f8,sampler,iVar5,iVar6,coordY);
      local_b8 = ZEXT416((uint)local_19c);
      uVar7 = extraout_EAX;
      if (TVar4 == TEXTURECHANNELCLASS_FLOATING_POINT) {
        local_b8._0_4_ = computeBilinearSearchStepFromFloatLine(prec,&local_118);
        local_b8._4_4_ = extraout_XMM0_Db;
        local_b8._8_4_ = extraout_XMM0_Dc;
        local_b8._12_4_ = extraout_XMM0_Dd;
        uVar7 = extraout_EAX_00;
      }
      fVar15 = (float)iVar9;
      fVar18 = (local_d8 + -0.5) - fVar15;
      fVar19 = (fStack_d4 + -0.5) - fVar15;
      auVar1._4_4_ = -(uint)(1.0 < fVar18);
      auVar1._0_4_ = -(uint)(1.0 < fVar18);
      auVar1._8_4_ = -(uint)(1.0 < fVar19);
      auVar1._12_4_ = -(uint)(1.0 < fVar19);
      uVar8 = movmskpd(uVar7,auVar1);
      local_98 = 1.0;
      fVar11 = 0.0;
      fVar16 = 0.0;
      fVar17 = 0.0;
      if ((uVar8 & 1) == 0) {
        local_98 = fVar18;
        fVar11 = fVar19;
        fVar16 = 0.0 - fVar15;
        fVar17 = 0.0 - fVar15;
      }
      local_a8 = 1.0;
      fVar21 = 0.0;
      if ((uVar8 & 2) == 0) {
        local_a8 = fVar19;
        fVar21 = fVar19;
      }
      local_98 = (float)(~-(uint)(fVar18 < 0.0) & (uint)local_98);
      uStack_94 = ~(uint)fVar19 & (uint)fVar11;
      uStack_90 = ~(uint)(0.0 - fVar15) & (uint)fVar16;
      uStack_8c = ~(uint)(0.0 - fVar15) & (uint)fVar17;
      local_a8 = (float)(~-(uint)(fVar19 < 0.0) & (uint)local_a8);
      uStack_a4 = ~(uint)fVar19 & (uint)fVar21;
      uStack_a0 = ~(uint)fVar19 & (uint)fVar21;
      uStack_9c = ~(uint)fVar19 & (uint)fVar21;
      iVar5 = (int)fVar13;
      while (iVar9 = iVar10, iVar5 <= (int)fVar14) {
        ColorLine::ColorLine(&local_70);
        iVar6 = TexVerifierUtil::wrap(sampler->wrapS,iVar5,dim_00);
        iVar9 = iVar5 + 1;
        x1 = TexVerifierUtil::wrap(sampler->wrapS,iVar9,dim_00);
        lookupLine(&local_70,level1,sampler,iVar6,x1,coordY);
        fVar11 = local_19c;
        uVar7 = extraout_EAX_01;
        if (TVar4 == TEXTURECHANNELCLASS_FLOATING_POINT) {
          fVar11 = computeBilinearSearchStepFromFloatLine(prec,&local_70);
          uVar7 = extraout_EAX_02;
        }
        fVar16 = (local_e0 + -0.5) - (float)iVar5;
        fVar17 = (fStack_dc + -0.5) - (float)iVar5;
        auVar2._4_4_ = -(uint)(fVar16 < 0.0);
        auVar2._0_4_ = -(uint)(fVar16 < 0.0);
        auVar2._8_4_ = -(uint)(fVar17 < 0.0);
        auVar2._12_4_ = -(uint)(fVar17 < 0.0);
        uVar8 = movmskpd(uVar7,auVar2);
        local_1a0 = 0.0;
        local_1a4 = 0.0;
        if (((uVar8 & 1) == 0) && (local_1a4 = 1.0, fVar16 <= 1.0)) {
          local_1a4 = fVar16;
        }
        if (((uVar8 & 2) == 0) && (local_1a0 = 1.0, fVar17 <= 1.0)) {
          local_1a0 = fVar17;
        }
        min(local_40,&local_118);
        min((tcu *)local_d0,&local_70);
        min<float,4>((tcu *)&local_138,(Vector<float,_4> *)local_40,(Vector<float,_4> *)local_d0);
        b = local_e8;
        operator-((tcu *)&local_128,&local_138,local_e8);
        max((tcu *)local_d0,&local_118);
        max(local_50,&local_70);
        max<float,4>(local_40,(Vector<float,_4> *)local_d0,(Vector<float,_4> *)local_50);
        operator+((tcu *)&local_138,(Vector<float,_4> *)local_40,b);
        greaterThanEqual<float,4>(local_50,result,&local_128);
        lessThanEqual<float,4>(local_bc,result,&local_138);
        logicalAnd<bool,4>((tcu *)local_d0,(Vector<bool,_4> *)local_50,(Vector<bool,_4> *)local_bc);
        logicalNot<bool,4>(local_c0,local_f0);
        logicalOr<bool,4>(local_40,local_d0,(Vector<bool,_4> *)local_c0);
        bVar3 = boolAll<4>((Vector<bool,_4> *)local_40);
        iVar5 = iVar9;
        if (bVar3) {
          fVar17 = (float)(~-(uint)((float)local_b8._0_4_ <= fVar11) & (uint)fVar11 |
                          -(uint)((float)local_b8._0_4_ <= fVar11) & local_b8._0_4_);
          fVar16 = local_a8 + fVar17;
          fVar11 = local_98;
          uVar8 = uStack_94;
          uVar20 = uStack_90;
          uVar22 = uStack_8c;
          while (fVar11 < fVar16) {
            fVar15 = (float)(~-(uint)(fVar11 <= local_a8) & (uint)local_a8 |
                            -(uint)(fVar11 <= local_a8) & (uint)fVar11);
            local_88 = fVar11;
            uStack_84 = uVar8;
            uStack_80 = uVar20;
            uStack_7c = uVar22;
            operator*((tcu *)&local_138,1.0 - fVar15,&local_118.p0);
            operator*(local_40,fVar15,&local_118.p1);
            operator+((tcu *)&local_128,&local_138,(Vector<float,_4> *)local_40);
            for (fVar11 = local_1a4; fVar11 <= local_1a0; fVar11 = fVar11 + fVar17) {
              operator*(local_40,1.0 - fVar11,&local_70.p0);
              operator*((tcu *)local_d0,fVar11,&local_70.p1);
              operator+((tcu *)&local_138,(Vector<float,_4> *)local_40,(Vector<float,_4> *)local_d0)
              ;
              bVar3 = isLinearRangeValid(prec,&local_128,(Vec4 *)&local_138,fBounds,result);
              if (bVar3) {
                return local_1a5;
              }
            }
            uVar8 = uStack_84;
            uVar20 = uStack_80;
            uVar22 = uStack_7c;
            fVar11 = local_88 + fVar17;
          }
        }
      }
    }
  }
  else {
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&local_128,sampler->normalizedCoords,dim,coordX,
               (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&local_138,sampler->normalizedCoords,dim_00,coordX,
               (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
    fVar11 = floorf(local_128.m_data[0]);
    fVar12 = floorf(local_128.m_data[1]);
    fVar13 = floorf(local_138.m_data[0]);
    fVar14 = floorf(local_138.m_data[1]);
    for (iVar9 = (int)fVar11; local_1a5 = iVar9 <= (int)fVar12, iVar10 = (int)fVar13,
        iVar9 <= (int)fVar12; iVar9 = iVar9 + 1) {
      while (iVar10 <= (int)fVar14) {
        iVar5 = TexVerifierUtil::wrap(sampler->wrapS,iVar9,dim);
        lookup<float>((tcu *)&local_118,level0,sampler,iVar5,coordY,0);
        iVar5 = TexVerifierUtil::wrap(sampler->wrapS,iVar10,dim_00);
        lookup<float>((tcu *)&local_70,level1,sampler,iVar5,coordY,0);
        bVar3 = isLinearRangeValid(prec,&local_118.p0,&local_70.p0,fBounds,result);
        iVar10 = iVar10 + 1;
        if (bVar3) {
          return local_1a5;
        }
      }
    }
  }
  return local_1a5;
}

Assistant:

static bool isMipmapLinearSampleResultValid (const ConstPixelBufferAccess&		level0,
										     const ConstPixelBufferAccess&		level1,
											 const Sampler&						sampler,
										     const Sampler::FilterMode			levelFilter,
										     const LookupPrecision&				prec,
										     const float						coordX,
											 const int							coordY,
										     const Vec2&						fBounds,
										     const Vec4&						result)
{
	if (levelFilter == Sampler::LINEAR)
		return isLinearMipmapLinearSampleResultValid(level0, level1, sampler, prec, coordX, coordY, fBounds, result);
	else
		return isNearestMipmapLinearSampleResultValid(level0, level1, sampler, prec, coordX, coordY, fBounds, result);
}